

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cab_session.cpp
# Opt level: O2

void __thiscall cab_session::send_request(cab_session *this,request *request)

{
  state_type sVar1;
  socket_type sVar2;
  service_type *psVar3;
  error_category *peVar4;
  bool bVar5;
  undefined3 uVar6;
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Var7;
  pointer puVar8;
  size_t sVar9;
  anon_class_24_2_3fe5b907 local_98;
  shared_ptr<cab_session> self;
  ptr local_68;
  _Vector_base<unsigned_char,_std::allocator<unsigned_char>_> local_50;
  external_add_request_message add_message;
  
  add_message.src = ::request::src(request);
  add_message.dst = ::request::dst(request);
  add_message.passengers = ::request::passengers(request);
  std::__shared_ptr<cab_session,(__gnu_cxx::_Lock_policy)2>::__shared_ptr<cab_session,void>
            ((__shared_ptr<cab_session,(__gnu_cxx::_Lock_policy)2> *)&self,
             (__weak_ptr<cab_session,_(__gnu_cxx::_Lock_policy)2> *)this);
  basic_message<external_add_request_message,_(message_id)69>::to_buffer
            ((buffer *)&local_50,
             (basic_message<external_add_request_message,_(message_id)69> *)&add_message);
  local_98.this = this;
  std::__shared_ptr<cab_session,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
            (&local_98.self.super___shared_ptr<cab_session,_(__gnu_cxx::_Lock_policy)2>,
             &self.super___shared_ptr<cab_session,_(__gnu_cxx::_Lock_policy)2>);
  psVar3 = (this->_socket).
           super_basic_socket<boost::asio::ip::tcp,_boost::asio::execution::any_executor<boost::asio::execution::context_as_t<boost::asio::execution_context_&>,_boost::asio::execution::detail::blocking::never_t<0>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::blocking::possibly_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::tracked_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::untracked_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::fork_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::continuation_t<0>_>_>_>
           .impl_.service_;
  local_68.h = &local_98;
  local_68.p = (reactive_socket_send_op<boost::asio::const_buffers_1,_(lambda_at__workspace_llm4binary_github_license_all_cmakelists_25_Stazer[P]autonomouscabs_backend_cab_session_cpp:117:70),_boost::asio::execution::any_executor<boost::asio::execution::context_as_t<boost::asio::execution_context_&>,_boost::asio::execution::detail::blocking::never_t<0>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::blocking::possibly_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::tracked_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::untracked_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::fork_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::continuation_t<0>_>_>_>
                *)boost::asio::asio_handler_allocate(0xa0);
  _Var7._M_pi = local_98.self.super___shared_ptr<cab_session,_(__gnu_cxx::_Lock_policy)2>.
                _M_refcount._M_pi;
  sVar9 = (long)local_50._M_impl.super__Vector_impl_data._M_finish -
          (long)local_50._M_impl.super__Vector_impl_data._M_start;
  puVar8 = (pointer)0x0;
  if (sVar9 != 0) {
    puVar8 = local_50._M_impl.super__Vector_impl_data._M_start;
  }
  sVar2 = (this->_socket).
          super_basic_socket<boost::asio::ip::tcp,_boost::asio::execution::any_executor<boost::asio::execution::context_as_t<boost::asio::execution_context_&>,_boost::asio::execution::detail::blocking::never_t<0>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::blocking::possibly_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::tracked_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::untracked_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::fork_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::continuation_t<0>_>_>_>
          .impl_.implementation_.super_base_implementation_type.socket_;
  sVar1 = (this->_socket).
          super_basic_socket<boost::asio::ip::tcp,_boost::asio::execution::any_executor<boost::asio::execution::context_as_t<boost::asio::execution_context_&>,_boost::asio::execution::detail::blocking::never_t<0>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::blocking::possibly_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::tracked_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::untracked_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::fork_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::continuation_t<0>_>_>_>
          .impl_.implementation_.super_base_implementation_type.state_;
  ((local_68.p)->super_reactive_socket_send_op_base<boost::asio::const_buffers_1>).super_reactor_op.
  super_operation.next_ = (scheduler_operation *)0x0;
  ((local_68.p)->super_reactive_socket_send_op_base<boost::asio::const_buffers_1>).super_reactor_op.
  super_operation.func_ =
       boost::asio::detail::
       reactive_socket_send_op<boost::asio::const_buffers_1,_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/Stazer[P]autonomouscabs/backend/cab_session.cpp:117:70),_boost::asio::execution::any_executor<boost::asio::execution::context_as_t<boost::asio::execution_context_&>,_boost::asio::execution::detail::blocking::never_t<0>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::blocking::possibly_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::tracked_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::untracked_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::fork_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::continuation_t<0>_>_>_>
       ::do_complete;
  ((local_68.p)->super_reactive_socket_send_op_base<boost::asio::const_buffers_1>).super_reactor_op.
  super_operation.task_result_ = 0;
  bVar5 = (psVar3->super_reactive_socket_service_base).success_ec_.failed_;
  uVar6 = *(undefined3 *)&(psVar3->super_reactive_socket_service_base).success_ec_.field_0x5;
  peVar4 = (psVar3->super_reactive_socket_service_base).success_ec_.cat_;
  ((local_68.p)->super_reactive_socket_send_op_base<boost::asio::const_buffers_1>).super_reactor_op.
  ec_.val_ = (psVar3->super_reactive_socket_service_base).success_ec_.val_;
  ((local_68.p)->super_reactive_socket_send_op_base<boost::asio::const_buffers_1>).super_reactor_op.
  ec_.failed_ = bVar5;
  *(undefined3 *)
   &((local_68.p)->super_reactive_socket_send_op_base<boost::asio::const_buffers_1>).
    super_reactor_op.ec_.field_0x5 = uVar6;
  ((local_68.p)->super_reactive_socket_send_op_base<boost::asio::const_buffers_1>).super_reactor_op.
  ec_.cat_ = peVar4;
  ((local_68.p)->super_reactive_socket_send_op_base<boost::asio::const_buffers_1>).super_reactor_op.
  bytes_transferred_ = 0;
  ((local_68.p)->super_reactive_socket_send_op_base<boost::asio::const_buffers_1>).super_reactor_op.
  perform_func_ =
       boost::asio::detail::reactive_socket_send_op_base<boost::asio::const_buffers_1>::do_perform;
  ((local_68.p)->super_reactive_socket_send_op_base<boost::asio::const_buffers_1>).socket_ = sVar2;
  ((local_68.p)->super_reactive_socket_send_op_base<boost::asio::const_buffers_1>).state_ = sVar1;
  ((local_68.p)->super_reactive_socket_send_op_base<boost::asio::const_buffers_1>).buffers_.
  super_const_buffer.data_ = puVar8;
  ((local_68.p)->super_reactive_socket_send_op_base<boost::asio::const_buffers_1>).buffers_.
  super_const_buffer.size_ = sVar9;
  ((local_68.p)->super_reactive_socket_send_op_base<boost::asio::const_buffers_1>).flags_ = 0;
  ((local_68.p)->handler_).this = local_98.this;
  ((local_68.p)->handler_).self.super___shared_ptr<cab_session,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       local_98.self.super___shared_ptr<cab_session,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  local_98.self.super___shared_ptr<cab_session,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  ((local_68.p)->handler_).self.super___shared_ptr<cab_session,_(__gnu_cxx::_Lock_policy)2>.
  _M_refcount._M_pi = _Var7._M_pi;
  local_98.self.super___shared_ptr<cab_session,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)0x0;
  local_68.v = local_68.p;
  boost::asio::detail::
  handler_work_base<boost::asio::execution::any_executor<boost::asio::execution::context_as_t<boost::asio::execution_context_&>,_boost::asio::execution::detail::blocking::never_t<0>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::blocking::possibly_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::tracked_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::untracked_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::fork_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::continuation_t<0>_>_>,_void,_boost::asio::io_context,_boost::asio::executor,_void>
  ::handler_work_base(&((local_68.p)->work_).
                       super_handler_work_base<boost::asio::execution::any_executor<boost::asio::execution::context_as_t<boost::asio::execution_context_&>,_boost::asio::execution::detail::blocking::never_t<0>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::blocking::possibly_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::tracked_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::untracked_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::fork_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::continuation_t<0>_>_>,_void,_boost::asio::io_context,_boost::asio::executor,_void>
                      ,&(this->_socket).
                        super_basic_socket<boost::asio::ip::tcp,_boost::asio::execution::any_executor<boost::asio::execution::context_as_t<boost::asio::execution_context_&>,_boost::asio::execution::detail::blocking::never_t<0>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::blocking::possibly_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::tracked_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::untracked_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::fork_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::continuation_t<0>_>_>_>
                        .impl_.executor_);
  boost::asio::detail::reactive_socket_service_base::start_op
            (&psVar3->super_reactive_socket_service_base,
             &(this->_socket).
              super_basic_socket<boost::asio::ip::tcp,_boost::asio::execution::any_executor<boost::asio::execution::context_as_t<boost::asio::execution_context_&>,_boost::asio::execution::detail::blocking::never_t<0>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::blocking::possibly_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::tracked_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::untracked_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::fork_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::continuation_t<0>_>_>_>
              .impl_.implementation_.super_base_implementation_type,1,(reactor_op *)local_68.p,false
             ,true,(bool)((this->_socket).
                          super_basic_socket<boost::asio::ip::tcp,_boost::asio::execution::any_executor<boost::asio::execution::context_as_t<boost::asio::execution_context_&>,_boost::asio::execution::detail::blocking::never_t<0>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::blocking::possibly_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::tracked_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::untracked_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::fork_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::continuation_t<0>_>_>_>
                          .impl_.implementation_.super_base_implementation_type.state_ >> 4 &
                         sVar9 == 0));
  local_68.v = (reactive_socket_send_op<boost::asio::const_buffers_1,_(lambda_at__workspace_llm4binary_github_license_all_cmakelists_25_Stazer[P]autonomouscabs_backend_cab_session_cpp:117:70),_boost::asio::execution::any_executor<boost::asio::execution::context_as_t<boost::asio::execution_context_&>,_boost::asio::execution::detail::blocking::never_t<0>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::blocking::possibly_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::tracked_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::untracked_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::fork_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::continuation_t<0>_>_>_>
                *)0x0;
  local_68.p = (reactive_socket_send_op<boost::asio::const_buffers_1,_(lambda_at__workspace_llm4binary_github_license_all_cmakelists_25_Stazer[P]autonomouscabs_backend_cab_session_cpp:117:70),_boost::asio::execution::any_executor<boost::asio::execution::context_as_t<boost::asio::execution_context_&>,_boost::asio::execution::detail::blocking::never_t<0>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::blocking::possibly_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::tracked_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::untracked_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::fork_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::continuation_t<0>_>_>_>
                *)0x0;
  boost::asio::detail::
  reactive_socket_send_op<boost::asio::const_buffers_1,_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/Stazer[P]autonomouscabs/backend/cab_session.cpp:117:70),_boost::asio::execution::any_executor<boost::asio::execution::context_as_t<boost::asio::execution_context_&>,_boost::asio::execution::detail::blocking::never_t<0>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::blocking::possibly_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::tracked_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::untracked_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::fork_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::continuation_t<0>_>_>_>
  ::ptr::~ptr(&local_68);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            (&local_98.self.super___shared_ptr<cab_session,_(__gnu_cxx::_Lock_policy)2>._M_refcount)
  ;
  std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base(&local_50);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            (&self.super___shared_ptr<cab_session,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
  return;
}

Assistant:

void cab_session::send_request(request& request)
{
    external_add_request_message add_message;
    add_message.src = static_cast<std::uint8_t>(request.src());
    add_message.dst = static_cast<std::uint8_t>(request.dst());
    add_message.passengers = request.passengers();

    auto self = shared_from_this();
    _socket.async_send(boost::asio::buffer(add_message.to_buffer()), [this, self](boost::system::error_code error_code, std::size_t written)
    {
        std::cout << "Data sent " << written << std::endl;
    });
}